

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_f5080d::PathSimplifier::splitLineAt
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,BVHNode *node,
          quint32 pointIndex,bool processAgain)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  quint32 qVar5;
  Element *pEVar6;
  QPoint *pQVar7;
  ElementBlock *pEVar8;
  long lVar9;
  QPoint QVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Element *pEVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  ElementBlock *pEVar17;
  Element *pEVar18;
  Node *pNVar19;
  Element *pEVar20;
  bool bVar21;
  
  pEVar6 = (node->field_3).element;
  uVar1 = pEVar6->indices[0];
  uVar2 = pEVar6->indices[1];
  pQVar7 = this->m_points->buffer;
  iVar3 = pQVar7[pointIndex].xp.m_i;
  iVar4 = pQVar7[pointIndex].yp.m_i;
  if (((pQVar7[uVar1].xp.m_i == iVar3) && (pQVar7[uVar1].yp.m_i == iVar4)) ||
     ((pQVar7[uVar2].xp.m_i == iVar3 && (pQVar7[uVar2].yp.m_i == iVar4)))) {
    bVar21 = false;
  }
  else {
    if (processAgain) {
      pEVar6->field_0x39 = pEVar6->field_0x39 & 0xfe;
    }
    pEVar6 = (node->field_3).element;
    pEVar8 = (this->m_elementAllocator).blocks;
    iVar3 = pEVar8->firstFree;
    iVar4 = pEVar8->blockSize;
    if (iVar3 < iVar4) {
      pEVar8->firstFree = iVar3 + 1;
      pEVar17 = (ElementBlock *)&pEVar8->elements[(long)iVar3 + -1].field_5;
    }
    else {
      pEVar17 = (ElementBlock *)malloc((long)iVar4 << 6 | 0x10);
      (this->m_elementAllocator).blocks = pEVar17;
      pEVar17->blockSize = iVar4;
      ((anon_union_8_2_075f57e8_for_Element_5 *)&pEVar17->next)->bvhNode = (Node *)pEVar8;
      pEVar17->firstFree = 1;
    }
    pEVar20 = pEVar17->elements;
    uVar11 = *(undefined8 *)pEVar6->indices;
    uVar12 = *(undefined8 *)(pEVar6->indices + 2);
    pEVar18 = pEVar6->next;
    pEVar13 = pEVar6->previous;
    iVar3 = pEVar6->winding;
    uVar16 = *(undefined4 *)&pEVar6->field_0x2c;
    uVar14 = *(undefined8 *)((long)&pEVar6->winding + 2);
    uVar15 = *(undefined8 *)((long)&pEVar6->field_5 + 2);
    pEVar20->middle = pEVar6->middle;
    *(undefined8 *)pEVar17->elements[0].indices = uVar11;
    *(undefined8 *)((long)&pEVar17->elements[0].winding + 2) = uVar14;
    *(undefined8 *)((long)&pEVar17->elements[0].field_5 + 2) = uVar15;
    pEVar17->elements[0].previous = pEVar13;
    pEVar17->elements[0].winding = iVar3;
    *(undefined4 *)&pEVar17->elements[0].field_0x2c = uVar16;
    *(undefined8 *)(pEVar17->elements[0].indices + 2) = uVar12;
    pEVar17->elements[0].next = pEVar18;
    pEVar17->elements[0].indices[0] = pointIndex;
    pEVar6->indices[1] = pointIndex;
    (pEVar6->middle).xp.m_i = pQVar7[pointIndex].xp.m_i + pQVar7[uVar1].xp.m_i >> 1;
    (pEVar6->middle).yp.m_i = pQVar7[pointIndex].yp.m_i + pQVar7[uVar1].yp.m_i >> 1;
    (pEVar20->middle).xp.m_i = pQVar7[pointIndex].xp.m_i + pQVar7[uVar2].xp.m_i >> 1;
    pEVar17->elements[0].middle.yp.m_i = pQVar7[pointIndex].yp.m_i + pQVar7[uVar2].yp.m_i >> 1;
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve
              (&this->m_elements,(this->m_elements).siz + 1);
    lVar9 = (this->m_elements).siz;
    (this->m_elements).buffer[lVar9] = pEVar20;
    (this->m_elements).siz = lVar9 + 1;
    iVar3 = (this->m_bvh).firstFree;
    iVar4 = (this->m_bvh).blockSize;
    if (iVar3 < iVar4) {
      (this->m_bvh).firstFree = iVar3 + 1;
      pEVar18 = (Element *)((this->m_bvh).nodeBlock + iVar3);
    }
    else {
      pEVar18 = (Element *)operator_new(0x28);
      *(undefined8 *)&(pEVar18->middle).yp = 0;
      pEVar18->indices[1] = 0;
      pEVar18->indices[2] = 0;
    }
    iVar3 = (this->m_bvh).firstFree;
    if (iVar3 < iVar4) {
      (this->m_bvh).firstFree = iVar3 + 1;
      pNVar19 = (this->m_bvh).nodeBlock + iVar3;
    }
    else {
      pNVar19 = (Node *)operator_new(0x28);
      (pNVar19->minimum).xp = 0;
      (pNVar19->minimum).yp = 0;
      (pNVar19->maximum).xp = 0;
      (pNVar19->maximum).yp = 0;
    }
    pNVar19->type = Leaf;
    (pEVar18->middle).xp.m_i = 0;
    pEVar18->next = pEVar6;
    (pNVar19->field_3).element = pEVar20;
    QVar10 = node->minimum;
    pNVar19->minimum = QVar10;
    *(QPoint *)&(pEVar18->middle).yp = QVar10;
    QVar10 = node->maximum;
    pNVar19->maximum = QVar10;
    *(QPoint *)(pEVar18->indices + 1) = QVar10;
    iVar4 = pQVar7[uVar1].xp.m_i;
    iVar3 = pQVar7[uVar2].xp.m_i;
    qVar5 = pQVar7[pointIndex].xp.m_i;
    (&pNVar19->minimum)[iVar3 <= iVar4].xp.m_i = qVar5;
    pEVar18->indices[(ulong)(iVar4 < iVar3) * 2 + -1] = qVar5;
    iVar4 = pQVar7[uVar1].yp.m_i;
    iVar3 = pQVar7[uVar2].yp.m_i;
    qVar5 = pQVar7[pointIndex].yp.m_i;
    (&pNVar19->minimum)[iVar3 <= iVar4].yp.m_i = qVar5;
    pEVar18->indices[(ulong)(iVar4 < iVar3) * 2] = qVar5;
    (pEVar18->next->field_5).edgeNode = (Node *)pEVar18;
    *(Node **)&(pNVar19->field_3).left[1].minimum.yp = pNVar19;
    node->type = Split;
    (node->field_3).element = pEVar18;
    node->right = pNVar19;
    bVar21 = true;
    if ((pEVar6->field_0x39 & 1) == 0) {
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve
                (elements,elements->siz + 1);
      lVar9 = elements->siz;
      elements->buffer[lVar9] = pEVar18->next;
      elements->siz = lVar9 + 1;
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve(elements,lVar9 + 2);
      lVar9 = elements->siz;
      *(anon_union_8_2_70fb368a_for_Node_4 *)(elements->buffer + lVar9) = pNVar19->field_3;
      elements->siz = lVar9 + 1;
    }
  }
  return bVar21;
}

Assistant:

bool PathSimplifier::splitLineAt(QDataBuffer<Element *> &elements, BVHNode *node,
                                 quint32 pointIndex, bool processAgain)
{
    Q_ASSERT(node->type == BVHNode::Leaf);
    Element *element = node->element;
    Q_ASSERT(element->degree == Element::Line);
    const QPoint &u = m_points->at(element->indices[0]);
    const QPoint &v = m_points->at(element->indices[1]);
    const QPoint &p = m_points->at(pointIndex);
    if (u == p || v == p)
        return false; // No split needed.

    if (processAgain)
        element->processed = false; // Needs to be processed again.

    Element *first = node->element;
    Element *second = m_elementAllocator.newElement();
    *second = *first;
    first->indices[1] = second->indices[0] = pointIndex;
    first->middle.rx() = (u.x() + p.x()) >> 1;
    first->middle.ry() = (u.y() + p.y()) >> 1;
    second->middle.rx() = (v.x() + p.x()) >> 1;
    second->middle.ry() = (v.y() + p.y()) >> 1;
    m_elements.add(second);

    BVHNode *left = m_bvh.newNode();
    BVHNode *right = m_bvh.newNode();
    left->type = right->type = BVHNode::Leaf;
    left->element = first;
    right->element = second;
    left->minimum = right->minimum = node->minimum;
    left->maximum = right->maximum = node->maximum;
    if (u.x() < v.x())
        left->maximum.rx() = right->minimum.rx() = p.x();
    else
        left->minimum.rx() = right->maximum.rx() = p.x();
    if (u.y() < v.y())
        left->maximum.ry() = right->minimum.ry() = p.y();
    else
        left->minimum.ry() = right->maximum.ry() = p.y();
    left->element->bvhNode = left;
    right->element->bvhNode = right;

    node->type = BVHNode::Split;
    node->left = left;
    node->right = right;

    if (!first->processed) {
        elements.add(left->element);
        elements.add(right->element);
    }
    return true;
}